

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_writer.c
# Opt level: O0

void dlep_writer_start_signal(dlep_writer *writer,uint16_t signal_type)

{
  autobuf *autobuf;
  uint16_t signal_type_local;
  dlep_writer *writer_local;
  undefined2 local_22;
  autobuf *local_20;
  uint16_t local_12;
  autobuf *local_10;
  
  writer->signal_type = signal_type;
  writer->signal_start = writer->out->_len;
  autobuf = writer->out;
  local_12 = htons(signal_type);
  local_10 = autobuf;
  abuf_memcpy(autobuf,&local_12,2);
  local_20 = writer->out;
  local_22 = 0;
  abuf_memcpy(local_20,&local_22,2);
  return;
}

Assistant:

void
dlep_writer_start_signal(struct dlep_writer *writer, uint16_t signal_type) {
  writer->signal_type = signal_type;
  writer->signal_start = abuf_getlen(writer->out);

  abuf_append_uint16(writer->out, htons(signal_type));
  abuf_append_uint16(writer->out, 0);
}